

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int kdialogPresent(void)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  char lBuff [1024];
  
  if (kdialogPresent::lKdialogPresent < 0) {
    iVar1 = zenityPresent();
    if ((iVar1 != 0) &&
       ((pcVar2 = getenv("XDG_SESSION_DESKTOP"), pcVar2 == (char *)0x0 ||
        ((iVar1 = strcmp(pcVar2,"KDE"), iVar1 != 0 && (iVar1 = strcmp(pcVar2,"lxqt"), iVar1 != 0))))
       )) {
      kdialogPresent::lKdialogPresent = 0;
      return 0;
    }
    kdialogPresent::lKdialogPresent = detectPresence("kdialog");
    if ((kdialogPresent::lKdialogPresent != 0) &&
       (pcVar2 = getenv("SSH_TTY"), pcVar2 == (char *)0x0)) {
      pFVar3 = popen("kdialog --attach 2>&1","r");
      pcVar2 = fgets(lBuff,0x400,pFVar3);
      if ((pcVar2 != (char *)0x0) &&
         ((pcVar2 = strstr("Unknown",lBuff), pcVar2 == (char *)0x0 &&
          (kdialogPresent::lKdialogPresent = 2, tinyfd_verbose != 0)))) {
        printf("kdialog-attach %d\n",2);
      }
      pclose(pFVar3);
      if (kdialogPresent::lKdialogPresent == 2) {
        kdialogPresent::lKdialogPresent = 1;
        pFVar3 = popen("kdialog --passivepopup 2>&1","r");
        pcVar2 = fgets(lBuff,0x400,pFVar3);
        if (((pcVar2 != (char *)0x0) && (pcVar2 = strstr("Unknown",lBuff), pcVar2 == (char *)0x0))
           && (kdialogPresent::lKdialogPresent = 2, tinyfd_verbose != 0)) {
          printf("kdialog-popup %d\n",2);
        }
        pclose(pFVar3);
      }
    }
  }
  iVar1 = graphicMode();
  if (iVar1 != 0) {
    iVar1 = kdialogPresent::lKdialogPresent;
  }
  return iVar1;
}

Assistant:

static int kdialogPresent( )
{
	static int lKdialogPresent = -1 ;
	char lBuff [MAX_PATH_OR_CMD] ;
	FILE * lIn ;
	char * lDesktop;

	if ( lKdialogPresent < 0 )
	{
		if ( zenityPresent() )
		{
			lDesktop = getenv("XDG_SESSION_DESKTOP");
			if ( !lDesktop  || ( strcmp(lDesktop, "KDE") && strcmp(lDesktop, "lxqt") ) )
			{
				lKdialogPresent = 0 ;
				return lKdialogPresent ;
			}
		}

		lKdialogPresent = detectPresence("kdialog") ;
		if ( lKdialogPresent && !getenv("SSH_TTY") )
		{
			lIn = popen( "kdialog --attach 2>&1" , "r" ) ;
			if ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
			{
				if ( ! strstr( "Unknown" , lBuff ) )
				{
					lKdialogPresent = 2 ;
					if (tinyfd_verbose) printf("kdialog-attach %d\n", lKdialogPresent);
				}
			}
			pclose( lIn ) ;

			if (lKdialogPresent == 2)
			{
				lKdialogPresent = 1 ;
				lIn = popen( "kdialog --passivepopup 2>&1" , "r" ) ;
				if ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
				{
					if ( ! strstr( "Unknown" , lBuff ) )
					{
						lKdialogPresent = 2 ;
						if (tinyfd_verbose) printf("kdialog-popup %d\n", lKdialogPresent);
					}
				}
				pclose( lIn ) ;
			}
		}
	}
	return graphicMode() ? lKdialogPresent : 0 ;
}